

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slicing.h
# Opt level: O0

uint32_t __thiscall
dg::Slicer<dg::LLVMNode>::mark
          (Slicer<dg::LLVMNode> *this,LLVMNode *start,uint32_t sl_id,bool forward_slice)

{
  bool bVar1;
  uint32_t uVar2;
  reference ppBVar3;
  reference ppLVar4;
  byte in_CL;
  uint32_t in_EDX;
  WalkAndMark<dg::LLVMNode> *in_RDI;
  WalkAndMark<dg::LLVMNode> wm2;
  LLVMNode *nd;
  iterator __end0_1;
  iterator __begin0_1;
  list<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_> *__range4;
  BBlock<dg::LLVMNode> *BB;
  iterator __end0;
  iterator __begin0;
  set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
  *__range3;
  set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> inslice;
  WalkAndMark<dg::LLVMNode> wm;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  value_type *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  uint32_t in_stack_fffffffffffffe34;
  LLVMNode *in_stack_fffffffffffffe38;
  WalkAndMark<dg::LLVMNode> *in_stack_fffffffffffffe40;
  _Self local_128;
  _Self local_120;
  list<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_> *local_118;
  BBlock<dg::LLVMNode> *local_110;
  _Self local_108;
  _Self local_100;
  set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
  *local_f8;
  WalkAndMark<dg::LLVMNode> local_c0;
  byte local_15;
  uint32_t local_14;
  
  local_15 = in_CL & 1;
  local_14 = in_EDX;
  if (in_EDX == 0) {
    local_14 = *(int *)((long)&(in_RDI->
                               super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>).
                               queue.Container.c.
                               super__Deque_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>.
                               _M_impl.super__Deque_impl_data + 4) + 1;
    *(uint32_t *)
     ((long)&(in_RDI->super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>).queue.
             Container.c.super__Deque_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>._M_impl.
             super__Deque_impl_data + 4) = local_14;
  }
  WalkAndMark<dg::LLVMNode>::WalkAndMark(in_RDI,SUB41((uint)in_stack_fffffffffffffe0c >> 0x18,0));
  WalkAndMark<dg::LLVMNode>::mark
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe34);
  if ((local_15 & 1) != 0) {
    std::set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>::set
              ((set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> *)
               0x18aa65);
    local_f8 = WalkAndMark<dg::LLVMNode>::getMarkedBlocks(&local_c0);
    local_100._M_node =
         (_Base_ptr)
         std::
         set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
         ::begin((set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
                  *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    local_108._M_node =
         (_Base_ptr)
         std::
         set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
         ::end((set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
                *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    while( true ) {
      bVar1 = std::operator!=(&local_100,&local_108);
      if (!bVar1) break;
      ppBVar3 = std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*>::operator*
                          ((_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*> *)0x18aacf);
      local_110 = *ppBVar3;
      local_118 = BBlock<dg::LLVMNode>::getNodes_abi_cxx11_(local_110);
      local_120._M_node =
           (_List_node_base *)
           std::__cxx11::list<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>::begin
                     ((list<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_> *)
                      CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      local_128._M_node =
           (_List_node_base *)
           std::__cxx11::list<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>::end
                     ((list<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_> *)
                      CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      while( true ) {
        bVar1 = std::operator!=(&local_120,&local_128);
        if (!bVar1) break;
        ppLVar4 = std::_List_iterator<dg::LLVMNode_*>::operator*
                            ((_List_iterator<dg::LLVMNode_*> *)0x18ab41);
        uVar2 = Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::getSlice
                          (&(*ppLVar4)->
                            super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>);
        if (uVar2 == local_14) {
          std::set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>::
          insert((set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> *)
                 CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                 in_stack_fffffffffffffe28);
        }
        std::_List_iterator<dg::LLVMNode_*>::operator++(&local_120);
      }
      std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*>::operator++
                ((_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*> *)in_RDI);
    }
    bVar1 = std::set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>::
            empty((set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> *
                  )0x18abb8);
    if (!bVar1) {
      WalkAndMark<dg::LLVMNode>::WalkAndMark
                (in_RDI,SUB41((uint)in_stack_fffffffffffffe0c >> 0x18,0));
      WalkAndMark<dg::LLVMNode>::mark
                (in_stack_fffffffffffffe40,
                 (set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> *)
                 in_stack_fffffffffffffe38,in_stack_fffffffffffffe34);
      WalkAndMark<dg::LLVMNode>::~WalkAndMark(in_RDI);
    }
    std::set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>::~set
              ((set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> *)
               0x18abf8);
  }
  WalkAndMark<dg::LLVMNode>::~WalkAndMark(in_RDI);
  return local_14;
}

Assistant:

uint32_t mark(NodeT *start, uint32_t sl_id = 0,
                  bool forward_slice = false) {
        if (sl_id == 0)
            sl_id = ++slice_id;

        WalkAndMark<NodeT> wm(forward_slice);
        wm.mark(start, sl_id);

        ///
        // If we are performing forward slicing,
        // we must do the slice executable as we now just
        // marked the nodes that are data dependent on the
        // slicing criterion. We do that by using these
        // nodes as slicing criteria in normal backward slicing.
        if (forward_slice) {
            std::set<NodeT *> inslice;
            for (auto *BB : wm.getMarkedBlocks()) {
#if ENABLE_CFG
                for (auto *nd : BB->getNodes()) {
                    if (nd->getSlice() == sl_id) {
                        inslice.insert(nd);
                    }
                }
#endif
            }

            // do backward slicing to make the slice executable
            if (!inslice.empty()) {
                WalkAndMark<NodeT> wm2;
                wm2.mark(inslice, sl_id);
            }
        }

        return sl_id;
    }